

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O2

void __thiscall
BRTS_XZ<UFPC>::InitCompressedDataMem
          (BRTS_XZ<UFPC> *this,Data_Compressed *data_compressed,MemMat<unsigned_char> *img)

{
  uchar uVar1;
  uint uVar2;
  int iVar3;
  Mat1b *pMVar4;
  int iVar5;
  uchar *puVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int j_base;
  int c;
  ulong uVar12;
  ulong *puVar13;
  int r;
  ulong uVar14;
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar2 = *(uint *)&pMVar4->field_0x8;
  iVar3 = *(int *)&pMVar4->field_0xc;
  uVar9 = iVar3 % 0x40;
  uVar14 = 0;
  iVar5 = iVar3 >> 6;
  if (iVar3 >> 6 < 1) {
    iVar5 = 0;
  }
  uVar8 = 0;
  if (0 < (int)uVar9) {
    uVar8 = (ulong)uVar9;
  }
  uVar11 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar11 = uVar14;
  }
  for (; uVar14 != uVar11; uVar14 = uVar14 + 1) {
    puVar13 = data_compressed->bits + (long)data_compressed->data_width * uVar14;
    for (c = 0; r = (int)uVar14, iVar5 << 6 != c; c = c + 0x40) {
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c);
      uVar1 = *puVar6;
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 1);
      uVar10 = (ulong)(uVar1 != '\0') + 2;
      if (*puVar6 == '\0') {
        uVar10 = (ulong)(uVar1 != '\0');
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 2);
      uVar12 = uVar10 + 4;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 3);
      uVar10 = uVar12 + 8;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 4);
      uVar12 = uVar10 | 0x10;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 5);
      uVar10 = uVar12 | 0x20;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 6);
      uVar12 = uVar10 | 0x40;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 7);
      uVar10 = uVar12 | 0x80;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 8);
      uVar12 = uVar10 | 0x100;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 9);
      uVar10 = uVar12 | 0x200;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 10);
      uVar12 = uVar10 | 0x400;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0xb);
      uVar10 = uVar12 | 0x800;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0xc);
      uVar12 = uVar10 | 0x1000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0xd);
      uVar10 = uVar12 | 0x2000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0xe);
      uVar12 = uVar10 | 0x4000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0xf);
      uVar10 = uVar12 | 0x8000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x10);
      uVar12 = uVar10 | 0x10000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x11);
      uVar10 = uVar12 | 0x20000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x12);
      uVar12 = uVar10 | 0x40000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x13);
      uVar10 = uVar12 | 0x80000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x14);
      uVar12 = uVar10 | 0x100000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x15);
      uVar10 = uVar12 | 0x200000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x16);
      uVar12 = uVar10 | 0x400000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x17);
      uVar10 = uVar12 | 0x800000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x18);
      uVar12 = uVar10 | 0x1000000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x19);
      uVar10 = uVar12 | 0x2000000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x1a);
      uVar12 = uVar10 | 0x4000000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x1b);
      uVar10 = uVar12 | 0x8000000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x1c);
      uVar12 = uVar10 | 0x10000000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x1d);
      uVar10 = uVar12 | 0x20000000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x1e);
      uVar12 = uVar10 | 0x40000000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x1f);
      uVar10 = uVar12 | 0x80000000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x20);
      uVar12 = uVar10 | 0x100000000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x21);
      uVar10 = uVar12 | 0x200000000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x22);
      uVar12 = uVar10 | 0x400000000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x23);
      uVar10 = uVar12 | 0x800000000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x24);
      uVar12 = uVar10 | 0x1000000000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x25);
      uVar10 = uVar12 | 0x2000000000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x26);
      uVar12 = uVar10 | 0x4000000000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x27);
      uVar10 = uVar12 | 0x8000000000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x28);
      uVar12 = uVar10 | 0x10000000000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x29);
      uVar10 = uVar12 | 0x20000000000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x2a);
      uVar12 = uVar10 | 0x40000000000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x2b);
      uVar10 = uVar12 | 0x80000000000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x2c);
      uVar12 = uVar10 | 0x100000000000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x2d);
      uVar10 = uVar12 | 0x200000000000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x2e);
      uVar12 = uVar10 | 0x400000000000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x2f);
      uVar10 = uVar12 | 0x800000000000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x30);
      uVar12 = uVar10 | 0x1000000000000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x31);
      uVar10 = uVar12 | 0x2000000000000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x32);
      uVar12 = uVar10 | 0x4000000000000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x33);
      uVar10 = uVar12 | 0x8000000000000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x34);
      uVar12 = uVar10 | 0x10000000000000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x35);
      uVar10 = uVar12 | 0x20000000000000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x36);
      uVar12 = uVar10 | 0x40000000000000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x37);
      uVar10 = uVar12 | 0x80000000000000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x38);
      uVar12 = uVar10 | 0x100000000000000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x39);
      uVar10 = uVar12 | 0x200000000000000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x3a);
      uVar12 = uVar10 | 0x400000000000000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x3b);
      uVar10 = uVar12 | 0x800000000000000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x3c);
      uVar12 = uVar10 | 0x1000000000000000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x3d);
      uVar10 = uVar12 | 0x2000000000000000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x3e);
      uVar12 = uVar10 | 0x4000000000000000;
      if (*puVar6 == '\0') {
        uVar12 = uVar10;
      }
      puVar6 = MemMat<unsigned_char>::operator()(img,r,c + 0x3f);
      uVar10 = uVar12 | 0x8000000000000000;
      if (*puVar6 == '\0') {
        uVar10 = uVar12;
      }
      *puVar13 = uVar10;
      puVar13 = puVar13 + 1;
    }
    uVar10 = 0;
    for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
      puVar6 = MemMat<unsigned_char>::operator()(img,r,(iVar3 - uVar9) + (int)uVar12);
      uVar7 = 0;
      if (*puVar6 != '\0') {
        uVar7 = 1L << ((byte)uVar12 & 0x3f);
      }
      uVar10 = uVar10 | uVar7;
    }
    *puVar13 = uVar10;
  }
  return;
}

Assistant:

void InitCompressedDataMem(Data_Compressed& data_compressed, MemMat<unsigned char>& img) {
        int w(img_.cols);
        int h(img_.rows);

        for (int i = 0; i < h; i++) {
            uint64_t* mbits = data_compressed[i];
            uchar* source = img_.ptr<uchar>(i);
            for (int j = 0; j < w >> 6; j++) {
                int j_base = (j << 6);
                uint64_t obits = 0;
                if (img(i, j_base + 0)) obits |= 0x0000000000000001;
                if (img(i, j_base + 1)) obits |= 0x0000000000000002;
                if (img(i, j_base + 2)) obits |= 0x0000000000000004;
                if (img(i, j_base + 3)) obits |= 0x0000000000000008;
                if (img(i, j_base + 4)) obits |= 0x0000000000000010;
                if (img(i, j_base + 5)) obits |= 0x0000000000000020;
                if (img(i, j_base + 6)) obits |= 0x0000000000000040;
                if (img(i, j_base + 7)) obits |= 0x0000000000000080;
                if (img(i, j_base + 8)) obits |= 0x0000000000000100;
                if (img(i, j_base + 9)) obits |= 0x0000000000000200;
                if (img(i, j_base + 10)) obits |= 0x0000000000000400;
                if (img(i, j_base + 11)) obits |= 0x0000000000000800;
                if (img(i, j_base + 12)) obits |= 0x0000000000001000;
                if (img(i, j_base + 13)) obits |= 0x0000000000002000;
                if (img(i, j_base + 14)) obits |= 0x0000000000004000;
                if (img(i, j_base + 15)) obits |= 0x0000000000008000;
                if (img(i, j_base + 16)) obits |= 0x0000000000010000;
                if (img(i, j_base + 17)) obits |= 0x0000000000020000;
                if (img(i, j_base + 18)) obits |= 0x0000000000040000;
                if (img(i, j_base + 19)) obits |= 0x0000000000080000;
                if (img(i, j_base + 20)) obits |= 0x0000000000100000;
                if (img(i, j_base + 21)) obits |= 0x0000000000200000;
                if (img(i, j_base + 22)) obits |= 0x0000000000400000;
                if (img(i, j_base + 23)) obits |= 0x0000000000800000;
                if (img(i, j_base + 24)) obits |= 0x0000000001000000;
                if (img(i, j_base + 25)) obits |= 0x0000000002000000;
                if (img(i, j_base + 26)) obits |= 0x0000000004000000;
                if (img(i, j_base + 27)) obits |= 0x0000000008000000;
                if (img(i, j_base + 28)) obits |= 0x0000000010000000;
                if (img(i, j_base + 29)) obits |= 0x0000000020000000;
                if (img(i, j_base + 30)) obits |= 0x0000000040000000;
                if (img(i, j_base + 31)) obits |= 0x0000000080000000;
                if (img(i, j_base + 32)) obits |= 0x0000000100000000;
                if (img(i, j_base + 33)) obits |= 0x0000000200000000;
                if (img(i, j_base + 34)) obits |= 0x0000000400000000;
                if (img(i, j_base + 35)) obits |= 0x0000000800000000;
                if (img(i, j_base + 36)) obits |= 0x0000001000000000;
                if (img(i, j_base + 37)) obits |= 0x0000002000000000;
                if (img(i, j_base + 38)) obits |= 0x0000004000000000;
                if (img(i, j_base + 39)) obits |= 0x0000008000000000;
                if (img(i, j_base + 40)) obits |= 0x0000010000000000;
                if (img(i, j_base + 41)) obits |= 0x0000020000000000;
                if (img(i, j_base + 42)) obits |= 0x0000040000000000;
                if (img(i, j_base + 43)) obits |= 0x0000080000000000;
                if (img(i, j_base + 44)) obits |= 0x0000100000000000;
                if (img(i, j_base + 45)) obits |= 0x0000200000000000;
                if (img(i, j_base + 46)) obits |= 0x0000400000000000;
                if (img(i, j_base + 47)) obits |= 0x0000800000000000;
                if (img(i, j_base + 48)) obits |= 0x0001000000000000;
                if (img(i, j_base + 49)) obits |= 0x0002000000000000;
                if (img(i, j_base + 50)) obits |= 0x0004000000000000;
                if (img(i, j_base + 51)) obits |= 0x0008000000000000;
                if (img(i, j_base + 52)) obits |= 0x0010000000000000;
                if (img(i, j_base + 53)) obits |= 0x0020000000000000;
                if (img(i, j_base + 54)) obits |= 0x0040000000000000;
                if (img(i, j_base + 55)) obits |= 0x0080000000000000;
                if (img(i, j_base + 56)) obits |= 0x0100000000000000;
                if (img(i, j_base + 57)) obits |= 0x0200000000000000;
                if (img(i, j_base + 58)) obits |= 0x0400000000000000;
                if (img(i, j_base + 59)) obits |= 0x0800000000000000;
                if (img(i, j_base + 60)) obits |= 0x1000000000000000;
                if (img(i, j_base + 61)) obits |= 0x2000000000000000;
                if (img(i, j_base + 62)) obits |= 0x4000000000000000;
                if (img(i, j_base + 63)) obits |= 0x8000000000000000;
                *mbits = obits, mbits++;
            }
            uint64_t obits_final = 0;
            int jbase = w - (w % 64);
            for (int j = 0; j < w % 64; j++) {
                if (img(i, jbase + j)) obits_final |= ((uint64_t)1 << j);
            }
            *mbits = obits_final;
        }
    }